

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O1

void jpeg_stdio_dest(j_compress_ptr cinfo,FILE *outfile)

{
  jpeg_destination_mgr *pjVar1;
  
  if (cinfo->dest == (jpeg_destination_mgr *)0x0) {
    pjVar1 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x38);
    cinfo->dest = pjVar1;
  }
  pjVar1 = cinfo->dest;
  pjVar1->init_destination = init_destination;
  pjVar1->empty_output_buffer = empty_output_buffer;
  pjVar1->term_destination = term_destination;
  pjVar1[1].next_output_byte = (JOCTET *)outfile;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_dest (j_compress_ptr cinfo, FILE * outfile)
{
  my_dest_ptr dest;

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same file without re-executing jpeg_stdio_dest.
   * This makes it dangerous to use this manager and a different destination
   * manager serially with the same JPEG object, because their private object
   * sizes may be different.  Caveat programmer.
   */
  if (cinfo->dest == NULL) {	/* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(my_destination_mgr));
  }

  dest = (my_dest_ptr) cinfo->dest;
  dest->pub.init_destination = init_destination;
  dest->pub.empty_output_buffer = empty_output_buffer;
  dest->pub.term_destination = term_destination;
  dest->outfile = outfile;
}